

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l10n.c
# Opt level: O1

void free_args(l10n_arg *args)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  
  lVar3 = 8;
  do {
    pcVar2 = *(char **)((long)args + lVar3 + -8);
    if (pcVar2 == (char *)0x0) break;
    cVar1 = *pcVar2;
    if (cVar1 == '$') {
      free(*(void **)((long)&args->name + lVar3));
    }
    else if (cVar1 == '@') {
      l10n_text_release(*(l10n_text **)((long)&args->name + lVar3));
    }
    free(*(void **)((long)args + lVar3 + -8));
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x88);
  free(args);
  return;
}

Assistant:

static void free_args(l10n_arg args[])
{
    int i;
    for (i = 0; i != NUM_ARGS && args[i].name; ++i) {
        char type = args[i].name[0];
        switch (type) {
        case L10N_PREFIX_L10N:
            l10n_text_release((l10n_text *)args[i].value.v);
            break;
        case L10N_PREFIX_STRING:
            free(args[i].value.s);
            break;
        default:
            break;
        }
        free(args[i].name);
    }
    free(args);
}